

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

UtcDate * FIX::UtcDateConvertor::convert(UtcDate *__return_storage_ptr__,string *value)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  int month;
  int date;
  long lVar6;
  FieldConvertError *pFVar7;
  char *pcVar8;
  int mday;
  int mon;
  int year;
  int c;
  int i;
  string *value_local;
  
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 8) {
    pFVar7 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar7,value);
    __cxa_throw(pFVar7,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  for (mon = 0; mon < 8; mon = mon + 1) {
    pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)value);
    if (9 < (int)*pcVar8 - 0x30U) {
      pFVar7 = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(pFVar7,value);
      __cxa_throw(pFVar7,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
    }
  }
  pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar1 = *pcVar8;
  pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar2 = *pcVar8;
  pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar3 = *pcVar8;
  pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar4 = *pcVar8;
  pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar5 = *pcVar8;
  pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)value);
  month = (cVar5 + -0x30) * 10 + (int)*pcVar8 + -0x30;
  if ((0 < month) && (month < 0xd)) {
    pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)value);
    cVar5 = *pcVar8;
    pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)value);
    date = (cVar5 + -0x30) * 10 + (int)*pcVar8 + -0x30;
    if ((0 < date) && (date < 0x20)) {
      UtcDate::UtcDate(__return_storage_ptr__,date,month,
                       (((cVar1 + -0x30) * 10 + (int)cVar2 + -0x30) * 10 + (int)cVar3 + -0x30) * 10
                       + (int)cVar4 + -0x30);
      return __return_storage_ptr__;
    }
    pFVar7 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar7,value);
    __cxa_throw(pFVar7,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  pFVar7 = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(pFVar7,value);
  __cxa_throw(pFVar7,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
}

Assistant:

EXCEPT(FieldConvertError) {
    if (value.size() != 8) {
      throw FieldConvertError(value);
    }

    int i = 0;
    for (int c = 0; c < 8; ++c) {
      if (!IS_DIGIT(value[i++])) {
        throw FieldConvertError(value);
      }
    }

    int year, mon, mday;

    i = 0;

    year = value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';

    mon = value[i++] - '0';
    mon = 10 * mon + value[i++] - '0';
    if (mon < 1 || 12 < mon) {
      throw FieldConvertError(value);
    }

    mday = value[i++] - '0';
    mday = 10 * mday + value[i++] - '0';
    if (mday < 1 || 31 < mday) {
      throw FieldConvertError(value);
    }

    return UtcDateOnly(mday, mon, year);
  }